

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_resize.c
# Opt level: O0

int cvBuildNordsieckArrayAdams
              (sunrealtype *t,N_Vector y,N_Vector *f,N_Vector *wrk,int order,sunrealtype hscale,
              N_Vector *zn)

{
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  double *in_RDI;
  int in_R8D;
  undefined8 *in_R9;
  double in_XMM0_Qa;
  double dVar1;
  int i_5;
  sunrealtype scale;
  int j_1;
  int i_4;
  int i_3;
  sunrealtype delta_t;
  int j;
  int i_2;
  int i_1;
  int i;
  int local_74;
  double local_70;
  int local_64;
  int local_60;
  int local_5c;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_4;
  
  if ((((in_RDI == (double *)0x0) || (in_RSI == 0)) || (in_RDX == (undefined8 *)0x0)) ||
     (((in_RCX == 0 || (in_R8D < 1)) || (in_R9 == (undefined8 *)0x0)))) {
    local_4 = -0x16;
  }
  else {
    for (local_44 = 0; local_44 < in_R8D; local_44 = local_44 + 1) {
      if (in_RDX[local_44] == 0) {
        return -0x16;
      }
      if (*(long *)(in_RCX + (long)local_44 * 8) == 0) {
        return -0x16;
      }
    }
    if (1 < in_R8D) {
      for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 1) {
        N_VScale(0x3ff0000000000000,in_RDX[local_48],*(undefined8 *)(in_RCX + (long)local_48 * 8));
      }
      for (local_4c = 1; local_4c < in_R8D; local_4c = local_4c + 1) {
        for (local_50 = in_R8D + -1; local_4c <= local_50; local_50 = local_50 + -1) {
          dVar1 = 1.0 / (in_RDI[local_50 - local_4c] - in_RDI[local_50]);
          N_VLinearSum(dVar1,-dVar1,*(undefined8 *)(in_RCX + (long)(local_50 + -1) * 8),
                       *(undefined8 *)(in_RCX + (long)local_50 * 8),
                       *(undefined8 *)(in_RCX + (long)local_50 * 8));
        }
      }
      N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RCX + (long)(in_R8D + -1) * 8),in_R9[1]);
      for (local_5c = 2; local_5c <= in_R8D; local_5c = local_5c + 1) {
        N_VConst(0,in_R9[local_5c]);
      }
      for (local_60 = in_R8D + -2; -1 < local_60; local_60 = local_60 + -1) {
        for (local_64 = in_R8D + -1; 0 < local_64; local_64 = local_64 + -1) {
          N_VLinearSum(*in_RDI - in_RDI[local_60],(double)local_64,in_R9[local_64 + 1],
                       in_R9[local_64],in_R9[local_64 + 1]);
        }
        N_VLinearSum(*in_RDI - in_RDI[local_60],0x3ff0000000000000,in_R9[1],
                     *(undefined8 *)(in_RCX + (long)local_60 * 8),in_R9[1]);
      }
    }
    N_VScale(0x3ff0000000000000,in_RSI,*in_R9);
    N_VScale(0x3ff0000000000000,*in_RDX,in_R9[1]);
    local_70 = 1.0;
    for (local_74 = 1; local_74 <= in_R8D; local_74 = local_74 + 1) {
      local_70 = (in_XMM0_Qa / (double)local_74) * local_70;
      N_VScale(local_70,in_R9[local_74],in_R9[local_74]);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int cvBuildNordsieckArrayAdams(sunrealtype* t, N_Vector y, N_Vector* f,
                                      N_Vector* wrk, int order,
                                      sunrealtype hscale, N_Vector* zn)
{
  /* Check for valid inputs */
  if (!t || !y || !f || !wrk || order < 1 || !zn) { return CV_ILL_INPUT; }

  for (int i = 0; i < order; i++)
  {
    if (!f[i]) { return CV_ILL_INPUT; }
    if (!wrk[i]) { return CV_ILL_INPUT; }
  }

  /* Compute Nordsieck array */
  if (order > 1)
  {
    /* Compute Newton polynomial coefficients interpolating f history */
    for (int i = 0; i < order; i++) { N_VScale(ONE, f[i], wrk[i]); }

    for (int i = 1; i < order; i++)
    {
      for (int j = order - 1; j >= i; j--)
      {
        /* Divided difference */
        sunrealtype delta_t = ONE / (t[j - i] - t[j]);
        N_VLinearSum(delta_t, wrk[j - 1], -delta_t, wrk[j], wrk[j]);
      }
    }

    /* Compute derivatives of Newton polynomial of f history */
    N_VScale(ONE, wrk[order - 1], zn[1]);
    for (int i = 2; i <= order; i++) { N_VConst(ZERO, zn[i]); }

    for (int i = order - 2; i >= 0; i--)
    {
      for (int j = order - 1; j > 0; j--)
      {
        N_VLinearSum(t[0] - t[i], zn[j + 1], j, zn[j], zn[j + 1]);
      }
      N_VLinearSum(t[0] - t[i], zn[1], ONE, wrk[i], zn[1]);
    }
  }

  /* Overwrite first two columns with input values */
  N_VScale(ONE, y, zn[0]);
  N_VScale(ONE, f[0], zn[1]);

  /* Scale entries */
  sunrealtype scale = ONE;
  for (int i = 1; i <= order; i++)
  {
    scale *= hscale / ((sunrealtype)i);
    N_VScale(scale, zn[i], zn[i]);
  }

  return CV_SUCCESS;
}